

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O2

void __thiscall sf::Shader::Shader(Shader *this)

{
  _Rb_tree_header *p_Var1;
  
  GlResource::GlResource((GlResource *)this);
  this->m_shaderProgram = 0;
  this->m_currentTexture = -1;
  p_Var1 = &(this->m_textures)._M_t._M_impl.super__Rb_tree_header;
  (this->m_textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  *(undefined8 *)&(this->m_textures)._M_t._M_impl = 0;
  *(undefined8 *)&(this->m_textures)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->m_textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_textures)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->m_uniforms)._M_t._M_impl.super__Rb_tree_header;
  (this->m_textures)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->m_uniforms)._M_t._M_impl = 0;
  *(undefined8 *)&(this->m_uniforms)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->m_uniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_uniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_uniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_uniforms)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Shader::Shader() :
m_shaderProgram (0),
m_currentTexture(-1),
m_textures      (),
m_uniforms      ()
{
}